

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O1

LatencyItem * __thiscall
LatencyCollector::getAggrItem
          (LatencyItem *__return_storage_ptr__,LatencyCollector *this,string *lat_name)

{
  atomic<unsigned_long> *paVar1;
  HistBin *pHVar2;
  LatencyItem *this_00;
  pointer pcVar3;
  int iVar4;
  size_t i;
  long lVar5;
  long *plVar6;
  string actual_name;
  MapWrapperSP cur_map_p;
  string local_a8;
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  ashared_ptr<MapWrapper> local_68;
  
  LatencyItem::LatencyItem(__return_storage_ptr__);
  if (lat_name->_M_string_length != 0) {
    local_68.lock.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    local_68.lock.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    local_68.lock.super___mutex_base._M_mutex._8_8_ = 0;
    local_68.lock.super___mutex_base._M_mutex._16_8_ = 0;
    local_68.object._M_b._M_p = (__base_type)(__pointer_type)0x0;
    local_68.lock.super___mutex_base._M_mutex.__align = 0;
    ashared_ptr<MapWrapper>::operator=(&local_68,&this->latestMap);
    plVar6 = *(long **)(*(long *)local_68.object._M_b._M_p + 0x10);
    if (plVar6 != (long *)0x0) {
      do {
        this_00 = (LatencyItem *)plVar6[5];
        LatencyItem::getActualFunction_abi_cxx11_(&local_a8,this_00);
        if ((local_a8._M_string_length == lat_name->_M_string_length) &&
           ((local_a8._M_string_length == 0 ||
            (iVar4 = bcmp(local_a8._M_dataplus._M_p,(lat_name->_M_dataplus)._M_p,
                          local_a8._M_string_length), iVar4 == 0)))) {
          pcVar3 = (__return_storage_ptr__->statName)._M_dataplus._M_p;
          local_88 = local_78;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_88,pcVar3,
                     pcVar3 + (__return_storage_ptr__->statName)._M_string_length);
          lVar5 = local_80;
          if (local_88 != local_78) {
            operator_delete(local_88);
          }
          if (lVar5 == 0) {
            LatencyItem::operator=(__return_storage_ptr__,this_00);
          }
          else {
            LOCK();
            paVar1 = &(__return_storage_ptr__->hist).count;
            (paVar1->super___atomic_base<unsigned_long>)._M_i =
                 (paVar1->super___atomic_base<unsigned_long>)._M_i +
                 (this_00->hist).count.super___atomic_base<unsigned_long>._M_i;
            UNLOCK();
            LOCK();
            paVar1 = &(__return_storage_ptr__->hist).sum;
            (paVar1->super___atomic_base<unsigned_long>)._M_i =
                 (paVar1->super___atomic_base<unsigned_long>)._M_i +
                 (this_00->hist).sum.super___atomic_base<unsigned_long>._M_i;
            UNLOCK();
            if ((__return_storage_ptr__->hist).max.super___atomic_base<unsigned_long>._M_i <
                (this_00->hist).max.super___atomic_base<unsigned_long>._M_i) {
              LOCK();
              (__return_storage_ptr__->hist).max.super___atomic_base<unsigned_long>._M_i =
                   (this_00->hist).max.super___atomic_base<unsigned_long>._M_i;
              UNLOCK();
            }
            lVar5 = 0;
            do {
              LOCK();
              pHVar2 = (__return_storage_ptr__->hist).bins + lVar5;
              (pHVar2->super___atomic_base<unsigned_long>)._M_i =
                   (pHVar2->super___atomic_base<unsigned_long>)._M_i +
                   (this_00->hist).bins[lVar5].super___atomic_base<unsigned_long>._M_i;
              UNLOCK();
              lVar5 = lVar5 + 1;
            } while (lVar5 != 0x41);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        plVar6 = (long *)*plVar6;
      } while (plVar6 != (long *)0x0);
    }
    ashared_ptr<MapWrapper>::reset(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

LatencyItem getAggrItem(const std::string& lat_name) {
        LatencyItem ret;
        if (lat_name.empty()) return ret;

        MapWrapperSP cur_map_p = latestMap;
        MapWrapper* cur_map = cur_map_p.get();

        for (auto& entry: cur_map->map) {
            LatencyItem *item = entry.second;
            std::string actual_name = item->getActualFunction();

            if (actual_name != lat_name) continue;

            if (ret.getName().empty()) {
                // Initialize.
                ret = *item;
            } else {
                // Already exists.
                ret += *item;
            }
        }

        return ret;
    }